

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall duckdb_re2::Compiler::ByteRange(Compiler *this,int lo,int hi,bool foldcase)

{
  long lVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  Frag FVar5;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  
  uVar2 = AllocInst(this,1);
  if ((int)uVar2 < 0) {
    uVar3 = 0;
    uStack_48 = 0;
  }
  else {
    uVar4 = (ulong)uVar2;
    Prog::Inst::InitByteRange
              ((this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + uVar4,lo,hi,
               (uint)foldcase,0);
    lVar1 = (uVar4 << 0x21) + uVar4 * 2;
    uStack_4c = (undefined4)lVar1;
    uStack_48 = (undefined4)((ulong)lVar1 >> 0x20);
    uVar3 = CONCAT44(uStack_4c,uVar2);
  }
  uVar4 = CONCAT44(uStack_44,uStack_48) & 0xffffff00ffffffff;
  FVar5.end.tail = (int)uVar4;
  FVar5.nullable = (bool)(char)(uVar4 >> 0x20);
  FVar5._13_3_ = (int3)(uVar4 >> 0x28);
  FVar5.begin = (int)uVar3;
  FVar5.end.head = (int)((ulong)uVar3 >> 0x20);
  return FVar5;
}

Assistant:

Frag Compiler::ByteRange(int lo, int hi, bool foldcase) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitByteRange(lo, hi, foldcase, 0);
  return Frag(id, PatchList::Mk(id << 1), false);
}